

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::AggressiveDCEPass::BlockIsInConstruct
          (AggressiveDCEPass *this,BasicBlock *header_block,BasicBlock *bb)

{
  Instruction *pIVar1;
  IRContext *this_00;
  uint32_t bb_id;
  uint32_t uVar2;
  bool bVar3;
  
  bb_id = 0;
  bVar3 = false;
  if (header_block != (BasicBlock *)0x0 && bb != (BasicBlock *)0x0) {
    pIVar1 = (bb->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    if (pIVar1->has_result_id_ == true) {
      bb_id = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
    }
    for (; bVar3 = bb_id != 0, bVar3;
        bb_id = StructuredCFGAnalysis::ContainingConstruct
                          ((this_00->struct_cfg_analysis_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
                           .super__Head_base<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_false>.
                           _M_head_impl,bb_id)) {
      pIVar1 = (header_block->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar2 = 0;
      if (pIVar1->has_result_id_ == true) {
        uVar2 = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
      }
      if (bb_id == uVar2) {
        return true;
      }
      this_00 = (this->super_MemPass).super_Pass.context_;
      if ((this_00->valid_analyses_ & kAnalysisStructuredCFG) == kAnalysisNone) {
        IRContext::BuildStructuredCFGAnalysis(this_00);
      }
    }
  }
  return bVar3;
}

Assistant:

bool AggressiveDCEPass::BlockIsInConstruct(BasicBlock* header_block,
                                           BasicBlock* bb) {
  if (bb == nullptr || header_block == nullptr) {
    return false;
  }

  uint32_t current_header = bb->id();
  while (current_header != 0) {
    if (current_header == header_block->id()) return true;
    current_header = context()->GetStructuredCFGAnalysis()->ContainingConstruct(
        current_header);
  }
  return false;
}